

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O3

MQTT_CLIENT_ACK_OPTION mqttNotificationCallback(MQTT_MESSAGE_HANDLE msgHandle,void *callbackCtx)

{
  IOTHUB_SYSTEM_PROPERTY_TYPE propertyType;
  code *pcVar1;
  bool bVar2;
  char cVar3;
  uint16_t uVar4;
  int iVar5;
  uint uVar6;
  IOTHUB_MESSAGE_RESULT IVar7;
  MAP_RESULT MVar8;
  int iVar9;
  QOS_VALUE QVar10;
  char *pcVar11;
  char *pcVar12;
  size_t sVar13;
  LOGGER_LOG p_Var14;
  undefined8 *__ptr;
  size_t sVar15;
  int *piVar16;
  APP_PAYLOAD *pAVar17;
  IOTHUB_MESSAGE_HANDLE iotHubMessageHandle;
  char *pcVar18;
  STRING_TOKENIZER_HANDLE_conflict pSVar19;
  STRING_HANDLE pSVar20;
  MAP_HANDLE handle;
  STRING_HANDLE pSVar21;
  STRING_HANDLE pSVar22;
  MESSAGE_DISPOSITION_CONTEXT_HANDLE dispositionContext;
  long lVar23;
  PDLIST_ENTRY Entry;
  size_t sVar24;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 uVar25;
  ulong local_60;
  ulong local_58;
  
  uVar25 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (callbackCtx == (void *)0x0 || msgHandle == (MQTT_MESSAGE_HANDLE)0x0) {
    return MQTT_CLIENT_ACK_NONE;
  }
  pcVar11 = mqttmessage_getTopicName(msgHandle);
  if (pcVar11 == (char *)0x0) {
    p_Var14 = xlogging_get_log_function();
    if (p_Var14 == (LOGGER_LOG)0x0) {
      return MQTT_CLIENT_ACK_NONE;
    }
    pcVar11 = "mqttNotificationCallback";
    pcVar12 = "Failure: NULL topic name encountered";
    iVar5 = 0x7f8;
    goto LAB_0012edd7;
  }
  iVar5 = InternStrnicmp(pcVar11,"$iothub/twin",0xc);
  if (iVar5 == 0) {
    pSVar19 = STRING_TOKENIZER_create_from_char(pcVar11);
    if (pSVar19 == (STRING_TOKENIZER_HANDLE_conflict)0x0) {
      p_Var14 = xlogging_get_log_function();
      if (p_Var14 != (LOGGER_LOG)0x0) {
        (*p_Var14)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                   ,"parseDeviceTwinTopicInfo",0x23a,1,
                   "Failed creating token from device twin topic.");
      }
    }
    else {
      pSVar20 = STRING_new();
      if (pSVar20 == (STRING_HANDLE)0x0) {
        p_Var14 = xlogging_get_log_function();
        if (p_Var14 != (LOGGER_LOG)0x0) {
          (*p_Var14)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                     ,"parseDeviceTwinTopicInfo",0x245,1,"Failed allocating new string .");
        }
        STRING_TOKENIZER_destroy(pSVar19);
      }
      else {
        uVar6 = STRING_TOKENIZER_get_next_token(pSVar19,pSVar20,"/");
        local_60 = (ulong)uVar6;
        local_58 = local_60;
        if (uVar6 == 0) {
          lVar23 = 0;
          do {
            if (lVar23 == 2) {
              pcVar11 = STRING_c_str(pSVar20);
              iVar5 = strcmp(pcVar11,"PATCH");
              if (iVar5 == 0) {
                local_60 = 1;
                pcVar11 = (char *)0x0;
                local_58 = 0;
                bVar2 = true;
                goto LAB_0012ed63;
              }
            }
            else if (lVar23 == 3) {
              pcVar11 = STRING_c_str(pSVar20);
              local_58 = atol(pcVar11);
            }
            else if (lVar23 == 4) {
              pcVar11 = STRING_c_str(pSVar20);
              iVar5 = strncmp(pcVar11,"?$rid=",6);
              if (iVar5 == 0) {
                pcVar11 = (char *)atol(pcVar11 + 6);
                bVar2 = true;
                local_60 = 0;
                goto LAB_0012ed63;
              }
              p_Var14 = xlogging_get_log_function();
              if (p_Var14 != (LOGGER_LOG)0x0) {
                (*p_Var14)(AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                           ,"parseDeviceTwinTopicInfo",0x266,1,
                           "requestId does not begin with string format %s","?$rid=");
              }
              break;
            }
            lVar23 = lVar23 + 1;
            iVar5 = STRING_TOKENIZER_get_next_token(pSVar19,pSVar20,"/");
          } while (iVar5 == 0);
          pcVar11 = (char *)0x0;
          local_60 = 0;
          bVar2 = false;
        }
        else {
          bVar2 = false;
        }
LAB_0012ed63:
        STRING_delete(pSVar20);
        STRING_TOKENIZER_destroy(pSVar19);
        if (bVar2) {
          pAVar17 = mqttmessage_getApplicationMsg(msgHandle);
          if (pAVar17 == (APP_PAYLOAD *)0x0) {
            p_Var14 = xlogging_get_log_function();
            if (p_Var14 == (LOGGER_LOG)0x0) {
              return MQTT_CLIENT_ACK_NONE;
            }
            pcVar11 = "processTwinNotification";
            pcVar12 = "Failure: invalid payload";
            iVar5 = 0x735;
            goto LAB_0012edd7;
          }
          if ((local_60 & 1) != 0) {
            (**(code **)((long)callbackCtx + 0x150))
                      (1,pAVar17->message,pAVar17->length,*(undefined8 *)((long)callbackCtx + 0x168)
                      );
            return MQTT_CLIENT_ACK_NONE;
          }
          Entry = (PDLIST_ENTRY)((long)callbackCtx + 0xd0);
          do {
            Entry = Entry->Flink;
            if (Entry == (PDLIST_ENTRY)((long)callbackCtx + 0xd0)) {
              return MQTT_CLIENT_ACK_NONE;
            }
          } while (pcVar11 != (char *)(ulong)*(ushort *)&Entry[-2].Blink);
          DList_RemoveEntryList(Entry);
          if (*(int *)&Entry[-1].Blink == 1) {
            if (Entry[1].Flink != (DLIST_ENTRY_TAG *)0x0) {
              (*(code *)Entry[1].Flink)(0,pAVar17->message,pAVar17->length,Entry[1].Blink);
              goto LAB_0012ef49;
            }
            (**(code **)((long)callbackCtx + 0x150))
                      (0,pAVar17->message,pAVar17->length,*(undefined8 *)((long)callbackCtx + 0x168)
                      );
          }
          else {
            (**(code **)((long)callbackCtx + 0x148))
                      (*(undefined4 *)((long)&Entry[-2].Blink + 4),local_58,
                       *(undefined8 *)((long)callbackCtx + 0x168));
          }
          subscribeToNotifyStateIfNeeded((PMQTTTRANSPORT_HANDLE_DATA)callbackCtx);
LAB_0012ef49:
          free(Entry + -3);
          return MQTT_CLIENT_ACK_NONE;
        }
      }
    }
    p_Var14 = xlogging_get_log_function();
    if (p_Var14 == (LOGGER_LOG)0x0) {
      return MQTT_CLIENT_ACK_NONE;
    }
    pcVar11 = "processTwinNotification";
    pcVar12 = "Failure: parsing device topic info";
    iVar5 = 0x72e;
    goto LAB_0012edd7;
  }
  iVar5 = InternStrnicmp(pcVar11,"$iothub/methods",0xf);
  if (iVar5 == 0) {
    pSVar20 = STRING_new();
    if (pSVar20 != (STRING_HANDLE)0x0) {
      __ptr = (undefined8 *)malloc(8);
      if (__ptr == (undefined8 *)0x0) {
        p_Var14 = xlogging_get_log_function();
        if (p_Var14 != (LOGGER_LOG)0x0) {
          pcVar11 = "Failure: allocating DEVICE_METHOD_INFO object";
          iVar5 = 0x773;
LAB_0012e5d8:
          (*p_Var14)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                     ,"processDeviceMethodNotification",iVar5,1,pcVar11);
        }
      }
      else {
        pSVar21 = STRING_new();
        *__ptr = pSVar21;
        if (pSVar21 == (STRING_HANDLE)0x0) {
          p_Var14 = xlogging_get_log_function();
          if (p_Var14 != (LOGGER_LOG)0x0) {
            (*p_Var14)(AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                       ,"processDeviceMethodNotification",0x77a,1,
                       "Failure constructing request_id string");
          }
        }
        else {
          pSVar19 = STRING_TOKENIZER_create_from_char(pcVar11);
          if (pSVar19 == (STRING_TOKENIZER_HANDLE_conflict)0x0) {
            p_Var14 = xlogging_get_log_function();
            if (p_Var14 != (LOGGER_LOG)0x0) {
              (*p_Var14)(AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                         ,"retrieveDeviceMethodRidInfo",0x1f8,1,
                         "Failed creating token from device twin topic.");
            }
          }
          else {
            pSVar22 = STRING_new();
            if (pSVar22 == (STRING_HANDLE)0x0) {
              p_Var14 = xlogging_get_log_function();
              if (p_Var14 != (LOGGER_LOG)0x0) {
                (*p_Var14)(AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                           ,"retrieveDeviceMethodRidInfo",0x200,1,"Failed allocating new string .");
              }
              STRING_TOKENIZER_destroy(pSVar19);
            }
            else {
              iVar5 = STRING_TOKENIZER_get_next_token(pSVar19,pSVar22,"/");
              if (iVar5 == 0) {
                lVar23 = 0;
                do {
                  if (lVar23 == 4) {
                    sVar15 = STRING_length(pSVar22);
                    if ((5 < sVar15) &&
                       (piVar16 = (int *)STRING_c_str(pSVar22),
                       (short)piVar16[1] == 0x3d64 && *piVar16 == 0x6972243f)) {
                      iVar5 = STRING_concat(pSVar21,(char *)((long)piVar16 + 6));
                      if (iVar5 == 0) {
                        STRING_delete(pSVar22);
                        STRING_TOKENIZER_destroy(pSVar19);
                        pAVar17 = mqttmessage_getApplicationMsg(msgHandle);
                        if (pAVar17 != (APP_PAYLOAD *)0x0) {
                          pcVar1 = *(code **)((long)callbackCtx + 0x158);
                          pcVar11 = STRING_c_str(pSVar20);
                          iVar5 = (*pcVar1)(pcVar11,pAVar17->message,pAVar17->length,__ptr,
                                            *(undefined8 *)((long)callbackCtx + 0x168));
                          if ((iVar5 == 0) ||
                             (p_Var14 = xlogging_get_log_function(), p_Var14 == (LOGGER_LOG)0x0))
                          goto LAB_0012f175;
                          pcVar11 = "Failure: IoTHubClientCore_LL_DeviceMethodComplete";
                          iVar5 = 0x78e;
                          goto LAB_0012e5d8;
                        }
                        p_Var14 = xlogging_get_log_function();
                        if (p_Var14 != (LOGGER_LOG)0x0) {
                          (*p_Var14)(AZ_LOG_ERROR,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                                     ,"processDeviceMethodNotification",0x788,1,
                                     "Failure: mqttmessage_getApplicationMsg");
                        }
                        STRING_delete(pSVar21);
                        goto LAB_0012f170;
                      }
                      p_Var14 = xlogging_get_log_function();
                      if (p_Var14 != (LOGGER_LOG)0x0) {
                        pcVar11 = "Failed STRING_concat failed.";
                        iVar5 = 0x21c;
                        goto LAB_0012f10c;
                      }
                      break;
                    }
                  }
                  else if ((lVar23 == 3) &&
                          (iVar5 = STRING_concat_with_STRING(pSVar20,pSVar22), iVar5 != 0)) {
                    p_Var14 = xlogging_get_log_function();
                    if (p_Var14 != (LOGGER_LOG)0x0) {
                      pcVar11 = "Failed STRING_concat_with_STRING.";
                      iVar5 = 0x20e;
LAB_0012f10c:
                      (*p_Var14)(AZ_LOG_ERROR,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                                 ,"retrieveDeviceMethodRidInfo",iVar5,1,pcVar11);
                    }
                    break;
                  }
                  lVar23 = lVar23 + 1;
                  iVar5 = STRING_TOKENIZER_get_next_token(pSVar19,pSVar22,"/");
                } while (iVar5 == 0);
              }
              STRING_delete(pSVar22);
              STRING_TOKENIZER_destroy(pSVar19);
            }
          }
          p_Var14 = xlogging_get_log_function();
          if (p_Var14 != (LOGGER_LOG)0x0) {
            (*p_Var14)(AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                       ,"processDeviceMethodNotification",0x77f,1,
                       "Failure: retrieve device topic info");
          }
          STRING_delete(pSVar21);
        }
LAB_0012f170:
        free(__ptr);
      }
LAB_0012f175:
      STRING_delete(pSVar20);
      return MQTT_CLIENT_ACK_NONE;
    }
    p_Var14 = xlogging_get_log_function();
    if (p_Var14 == (LOGGER_LOG)0x0) {
      return MQTT_CLIENT_ACK_NONE;
    }
    pcVar11 = "processDeviceMethodNotification";
    pcVar12 = "Failure: allocating method_name string value";
    iVar5 = 0x76c;
    goto LAB_0012edd7;
  }
  pcVar12 = STRING_c_str(*(STRING_HANDLE *)((long)callbackCtx + 8));
  if (pcVar12 == (char *)0x0) {
LAB_0012e0e9:
    pcVar12 = STRING_c_str(*(STRING_HANDLE *)((long)callbackCtx + 0x20));
    if (pcVar12 != (char *)0x0) {
      sVar13 = strlen(pcVar12);
      iVar5 = InternStrnicmp(pcVar11,pcVar12,sVar13 - 1);
      if (iVar5 == 0) {
        iVar5 = 3;
        bVar2 = true;
        goto LAB_0012e3be;
      }
    }
    p_Var14 = xlogging_get_log_function();
    if (p_Var14 != (LOGGER_LOG)0x0) {
      (*p_Var14)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                 ,"retrieveTopicType",0x29d,1,"Topic %s does not match any client is subscribed to",
                 pcVar11);
    }
    p_Var14 = xlogging_get_log_function();
    if (p_Var14 == (LOGGER_LOG)0x0) {
      return MQTT_CLIENT_ACK_NONE;
    }
    pcVar11 = "mqttNotificationCallback";
    pcVar12 = "Received unexpected topic.  Ignoring remainder of request";
    iVar5 = 0x7fc;
LAB_0012edd7:
    (*p_Var14)(AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
               ,pcVar11,iVar5,1,pcVar12);
    return MQTT_CLIENT_ACK_NONE;
  }
  sVar13 = strlen(pcVar12);
  iVar5 = InternStrnicmp(pcVar11,pcVar12,sVar13 - 1);
  if (iVar5 != 0) goto LAB_0012e0e9;
  bVar2 = false;
  iVar5 = 0;
LAB_0012e3be:
  pAVar17 = mqttmessage_getApplicationMsg(msgHandle);
  if (pAVar17 == (APP_PAYLOAD *)0x0) {
    p_Var14 = xlogging_get_log_function();
    if (p_Var14 == (LOGGER_LOG)0x0) {
      return MQTT_CLIENT_ACK_NONE;
    }
    pcVar11 = "processIncomingMessageNotification";
    pcVar12 = "Failure: invalid appPayload.";
    iVar5 = 0x7b6;
    goto LAB_0012edd7;
  }
  iotHubMessageHandle = IoTHubMessage_CreateFromByteArray(pAVar17->message,pAVar17->length);
  if (iotHubMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0) {
    p_Var14 = xlogging_get_log_function();
    if (p_Var14 == (LOGGER_LOG)0x0) {
      return MQTT_CLIENT_ACK_NONE;
    }
    pcVar11 = "processIncomingMessageNotification";
    pcVar12 = "Failure: IotHub Message creation has failed.";
    iVar5 = 0x7ba;
    goto LAB_0012edd7;
  }
  if (iVar5 == 0) {
    pcVar12 = STRING_c_str(*(STRING_HANDLE *)((long)callbackCtx + 8));
    sVar13 = strlen(pcVar12);
    pcVar11 = pcVar11 + (sVar13 - 1);
    if (pcVar11 == (char *)0x0) goto LAB_0012eb6d;
LAB_0012e6b1:
    if (*pcVar11 != '\0') {
      pSVar19 = STRING_TOKENIZER_create_from_char(pcVar11);
      if (pSVar19 == (STRING_TOKENIZER_HANDLE_conflict)0x0) {
        p_Var14 = xlogging_get_log_function();
        if (p_Var14 != (LOGGER_LOG)0x0) {
          pcVar11 = "failure allocating tokenizer";
          iVar5 = 0x6e1;
          goto LAB_0012f222;
        }
        goto LAB_0012f232;
      }
      pSVar20 = STRING_new();
      if (pSVar20 == (STRING_HANDLE)0x0) {
        p_Var14 = xlogging_get_log_function();
        if (p_Var14 == (LOGGER_LOG)0x0) {
          pSVar20 = (STRING_HANDLE)0x0;
        }
        else {
          pcVar11 = "Failure to allocate STRING_new.";
          pSVar20 = (STRING_HANDLE)0x0;
          iVar5 = 0x6e6;
LAB_0012f0ba:
          (*p_Var14)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                     ,"extractMqttProperties",iVar5,1,pcVar11);
        }
        goto LAB_0012f234;
      }
      handle = IoTHubMessage_Properties(iotHubMessageHandle);
      if (handle == (MAP_HANDLE)0x0) {
        p_Var14 = xlogging_get_log_function();
        if (p_Var14 != (LOGGER_LOG)0x0) {
          pcVar11 = "Failure to retrieve IoTHubMessage_properties.";
          iVar5 = 0x6eb;
          goto LAB_0012f0ba;
        }
        goto LAB_0012f234;
      }
      iVar5 = STRING_TOKENIZER_get_next_token(pSVar19,pSVar20,"&");
      if (iVar5 != 0) goto LAB_0012ecaf;
      do {
        pcVar11 = STRING_c_str(pSVar20);
        iVar5 = 0;
        if ((pcVar11 != (char *)0x0) && (*pcVar11 != '\0')) {
          pcVar12 = strchr(pcVar11,0x3d);
          iVar5 = 0;
          if ((pcVar12 != (char *)0x0) && (pcVar12[1] != '\0')) {
            pcVar18 = pcVar12 + 1;
            sVar13 = (long)pcVar12 - (long)pcVar11;
            lVar23 = 8;
            do {
              pcVar12 = *(char **)((long)&symm_key_interface.hsm_client_set_symm_key_info + lVar23);
              sVar24 = strlen(pcVar12);
              if ((sVar24 == sVar13) && (iVar5 = bcmp(pcVar11,pcVar12,sVar13), iVar5 == 0)) {
                propertyType = *(IOTHUB_SYSTEM_PROPERTY_TYPE *)
                                ((long)&sysPropList[0].propName + lVar23);
                iVar5 = 0;
                if (propertyType == IOTHUB_SYSTEM_PROPERTY_TYPE_SILENTLY_IGNORE) goto LAB_0012ea60;
                if (propertyType != IOTHUB_SYSTEM_PROPERTY_TYPE_APPLICATION_CUSTOM) {
                  if (*(char *)((long)callbackCtx + 0x108) == '\x01') {
                    pSVar21 = URL_DecodeString(pcVar18);
                    if (pSVar21 == (STRING_HANDLE)0x0) {
                      p_Var14 = xlogging_get_log_function();
                      iVar5 = 0x6aa;
                      if (p_Var14 != (LOGGER_LOG)0x0) {
                        iVar9 = 0x6a9;
                        pcVar11 = "Failed to URL decode property value";
LAB_0012eb19:
                        (*p_Var14)(AZ_LOG_ERROR,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                                   ,"addSystemPropertyToMessageWithDecodeIfNeeded",iVar9,1,pcVar11);
                      }
                    }
                    else {
                      pcVar11 = STRING_c_str(pSVar21);
                      iVar5 = addSystemPropertyToMessage(iotHubMessageHandle,propertyType,pcVar11);
                      if (iVar5 == 0) {
                        iVar5 = 0;
                      }
                      else {
                        p_Var14 = xlogging_get_log_function();
                        iVar5 = 0x6af;
                        if (p_Var14 != (LOGGER_LOG)0x0) {
                          iVar9 = 0x6ae;
                          pcVar11 = "Unable to set message property";
                          goto LAB_0012eb19;
                        }
                      }
                    }
                    STRING_delete(pSVar21);
                  }
                  else {
                    iVar9 = addSystemPropertyToMessage(iotHubMessageHandle,propertyType,pcVar18);
                    iVar5 = 0;
                    if (iVar9 != 0) {
                      p_Var14 = xlogging_get_log_function();
                      iVar5 = 0x6b8;
                      if (p_Var14 != (LOGGER_LOG)0x0) {
                        (*p_Var14)(AZ_LOG_ERROR,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                                   ,"addSystemPropertyToMessageWithDecodeIfNeeded",0x6b7,1,
                                   "Unable to set message property");
                      }
                    }
                  }
                  goto LAB_0012ea60;
                }
                break;
              }
              lVar23 = lVar23 + 0x10;
            } while (lVar23 != 0xe8);
            sVar24 = sVar13 + 1;
            if (sVar24 == 0) {
              sVar24 = 0xffffffffffffffff;
            }
            if (sVar24 == 0xffffffffffffffff) {
LAB_0012e8ba:
              p_Var14 = xlogging_get_log_function();
              iVar5 = 0x675;
              if (p_Var14 != (LOGGER_LOG)0x0) {
                (*p_Var14)(AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                           ,"addApplicationPropertyToMessage",0x674,1,
                           "Failed allocating property information, size:%zu",sVar24);
              }
              pcVar12 = (char *)0x0;
            }
            else {
              cVar3 = *(char *)((long)callbackCtx + 0x108);
              pcVar12 = (char *)malloc(sVar24);
              if (pcVar12 == (char *)0x0) goto LAB_0012e8ba;
              memcpy(pcVar12,pcVar11,sVar13);
              pcVar12[sVar13] = '\0';
              if (cVar3 == '\0') {
                MVar8 = Map_AddOrUpdate(handle,pcVar12,pcVar18);
                iVar5 = 0;
                if (MVar8 != MAP_OK) {
                  p_Var14 = xlogging_get_log_function();
                  iVar5 = 0x694;
                  if (p_Var14 != (LOGGER_LOG)0x0) {
                    (*p_Var14)(AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                               ,"addApplicationPropertyToMessage",0x693,1,"Map_AddOrUpdate failed.")
                    ;
                  }
                }
              }
              else {
                pSVar21 = URL_DecodeString(pcVar12);
                pSVar22 = URL_DecodeString(pcVar18);
                if ((pSVar21 == (STRING_HANDLE)0x0) || (pSVar22 == (STRING_HANDLE)0x0)) {
                  p_Var14 = xlogging_get_log_function();
                  iVar5 = 0x683;
                  if (p_Var14 != (LOGGER_LOG)0x0) {
                    iVar9 = 0x682;
                    pcVar11 = "Failed to URL decode property";
LAB_0012ea3a:
                    (*p_Var14)(AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                               ,"addApplicationPropertyToMessage",iVar9,1,pcVar11);
                  }
                }
                else {
                  pcVar11 = STRING_c_str(pSVar21);
                  pcVar18 = STRING_c_str(pSVar22);
                  MVar8 = Map_AddOrUpdate(handle,pcVar11,pcVar18);
                  iVar5 = 0;
                  if (MVar8 != MAP_OK) {
                    p_Var14 = xlogging_get_log_function();
                    iVar5 = 0x688;
                    if (p_Var14 != (LOGGER_LOG)0x0) {
                      iVar9 = 0x687;
                      pcVar11 = "Map_AddOrUpdate failed.";
                      goto LAB_0012ea3a;
                    }
                  }
                }
                STRING_delete(pSVar22);
                STRING_delete(pSVar21);
              }
            }
            free(pcVar12);
          }
        }
LAB_0012ea60:
        iVar9 = STRING_TOKENIZER_get_next_token(pSVar19,pSVar20,"&");
      } while (iVar9 == 0 && iVar5 == 0);
      STRING_delete(pSVar20);
      STRING_TOKENIZER_destroy(pSVar19);
      if (iVar5 == 0) goto LAB_0012ecbf;
      goto LAB_0012f244;
    }
    pSVar20 = (STRING_HANDLE)0x0;
    pSVar19 = (STRING_TOKENIZER_HANDLE_conflict)0x0;
LAB_0012ecaf:
    STRING_delete(pSVar20);
    STRING_TOKENIZER_destroy(pSVar19);
LAB_0012ecbf:
    dispositionContext = (MESSAGE_DISPOSITION_CONTEXT_HANDLE)malloc(8);
    if (dispositionContext == (MESSAGE_DISPOSITION_CONTEXT_HANDLE)0x0) {
      p_Var14 = xlogging_get_log_function();
      if (p_Var14 != (LOGGER_LOG)0x0) {
        (*p_Var14)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                   ,"createMessageDispositionContext",0x7a1,1,
                   "Failed allocating MESSAGE_DISPOSITION_CONTEXT");
      }
      p_Var14 = xlogging_get_log_function();
      if (p_Var14 == (LOGGER_LOG)0x0) goto LAB_0012f278;
      pcVar11 = "failed creating message disposition context";
      iVar5 = 0x7c7;
    }
    else {
      uVar4 = mqttmessage_getPacketId(msgHandle);
      dispositionContext->packet_id = uVar4;
      QVar10 = mqttmessage_getQosType(msgHandle);
      dispositionContext->qos_value = QVar10;
      IVar7 = IoTHubMessage_SetDispositionContext
                        (iotHubMessageHandle,dispositionContext,destroyMessageDispositionContext);
      if (IVar7 != IOTHUB_MESSAGE_OK) {
        p_Var14 = xlogging_get_log_function();
        if (p_Var14 != (LOGGER_LOG)0x0) {
          (*p_Var14)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                     ,"processIncomingMessageNotification",0x7cc,1,
                     "Failed setting disposition context in IOTHUB_MESSAGE_HANDLE");
        }
        free(dispositionContext);
        goto LAB_0012f278;
      }
      if (bVar2) {
        cVar3 = (**(code **)((long)callbackCtx + 0x120))();
        if (cVar3 != '\0') {
          return MQTT_CLIENT_ACK_NONE;
        }
        p_Var14 = xlogging_get_log_function();
        if (p_Var14 == (LOGGER_LOG)0x0) goto LAB_0012f278;
        pcVar11 = "IoTHubClientCore_LL_MessageCallbackFromInput returned false";
        iVar5 = 0x7d6;
      }
      else {
        cVar3 = (**(code **)((long)callbackCtx + 0x128))
                          (iotHubMessageHandle,*(undefined8 *)((long)callbackCtx + 0x168));
        if (cVar3 != '\0') {
          return MQTT_CLIENT_ACK_NONE;
        }
        p_Var14 = xlogging_get_log_function();
        if (p_Var14 == (LOGGER_LOG)0x0) goto LAB_0012f278;
        pcVar11 = "IoTHubClientCore_LL_MessageCallback returned false";
        iVar5 = 0x7e0;
      }
    }
  }
  else {
    if (iVar5 == 3) {
      pcVar12 = STRING_c_str(*(STRING_HANDLE *)((long)callbackCtx + 0x20));
      sVar13 = strlen(pcVar12);
      if (pcVar11 + (sVar13 - 1) == (char *)0x0) goto LAB_0012eb6d;
      pcVar12 = strchr(pcVar11 + (sVar13 - 1),0x2f);
      if ((pcVar12 == (char *)0x0) || (pcVar12[1] == '\0')) {
        p_Var14 = xlogging_get_log_function();
        if (p_Var14 != (LOGGER_LOG)0x0) {
          pcVar11 = "Cannot find \'/\' to mark beginning of input name";
          pcVar18 = (char *)0x0;
          iVar5 = 0x596;
          goto LAB_0012ec9a;
        }
LAB_0012f000:
        pcVar18 = (char *)0x0;
      }
      else {
        pcVar12 = pcVar12 + 1;
        pcVar11 = strchr(pcVar12,0x2f);
        if (pcVar11 == (char *)0x0) {
          p_Var14 = xlogging_get_log_function();
          if (p_Var14 == (LOGGER_LOG)0x0) goto LAB_0012f000;
          pcVar11 = "Cannot find \'/\' after input name";
          pcVar18 = (char *)0x0;
          iVar5 = 0x59e;
LAB_0012ec9a:
          (*p_Var14)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                     ,"addInputNamePropertyToMsg",iVar5,1,pcVar11);
        }
        else {
          sVar13 = (long)pcVar11 - (long)pcVar12;
          if (pcVar11 < pcVar12) {
            sVar13 = 0xffffffffffffffff;
          }
          sVar24 = sVar13 + 1;
          if (sVar24 == 0) {
            sVar24 = 0xffffffffffffffff;
          }
          if ((sVar24 == 0xffffffffffffffff) ||
             (pcVar18 = (char *)malloc(sVar24), pcVar18 == (char *)0x0)) {
            p_Var14 = xlogging_get_log_function();
            if (p_Var14 != (LOGGER_LOG)0x0) {
              (*p_Var14)(AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                         ,"addInputNamePropertyToMsg",0x5a8,1,"Cannot allocate input name, size:%zu"
                         ,sVar24);
            }
            pcVar18 = (char *)0x0;
          }
          else {
            memcpy(pcVar18,pcVar12,sVar13);
            pcVar18[sVar13] = '\0';
            IVar7 = IoTHubMessage_SetInputName(iotHubMessageHandle,pcVar18);
            if (IVar7 == IOTHUB_MESSAGE_OK) {
              pcVar11 = pcVar11 + 1;
              free(pcVar18);
              goto LAB_0012e6b1;
            }
            p_Var14 = xlogging_get_log_function();
            if (p_Var14 != (LOGGER_LOG)0x0) {
              pcVar11 = "Failed adding input name to msg";
              iVar5 = 0x5b2;
              goto LAB_0012ec9a;
            }
          }
        }
      }
      free(pcVar18);
      p_Var14 = xlogging_get_log_function();
      if (p_Var14 != (LOGGER_LOG)0x0) {
        pcVar11 = "failure adding input name to property.";
        iVar5 = 0x6d7;
        goto LAB_0012f222;
      }
    }
    else {
      p_Var14 = xlogging_get_log_function();
      if (p_Var14 != (LOGGER_LOG)0x0) {
        (*p_Var14)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                   ,"findMessagePropertyStart",0x65c,1,"ERROR: type %d is not expected",
                   CONCAT44(uVar25,iVar5));
      }
LAB_0012eb6d:
      p_Var14 = xlogging_get_log_function();
      if (p_Var14 != (LOGGER_LOG)0x0) {
        pcVar11 = "Cannot find start of properties";
        iVar5 = 0x6d2;
LAB_0012f222:
        (*p_Var14)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                   ,"extractMqttProperties",iVar5,1,pcVar11);
      }
    }
LAB_0012f232:
    pSVar20 = (STRING_HANDLE)0x0;
    pSVar19 = (STRING_TOKENIZER_HANDLE_conflict)0x0;
LAB_0012f234:
    STRING_delete(pSVar20);
    STRING_TOKENIZER_destroy(pSVar19);
LAB_0012f244:
    p_Var14 = xlogging_get_log_function();
    if (p_Var14 == (LOGGER_LOG)0x0) goto LAB_0012f278;
    pcVar11 = "failure extracting mqtt properties.";
    iVar5 = 0x7be;
  }
  (*p_Var14)(AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
             ,"processIncomingMessageNotification",iVar5,1,pcVar11);
LAB_0012f278:
  IoTHubMessage_Destroy(iotHubMessageHandle);
  return MQTT_CLIENT_ACK_NONE;
}

Assistant:

static MQTT_CLIENT_ACK_OPTION mqttNotificationCallback(MQTT_MESSAGE_HANDLE msgHandle, void* callbackCtx)
{
    if (msgHandle != NULL && callbackCtx != NULL)
    {
        PMQTTTRANSPORT_HANDLE_DATA transportData = (PMQTTTRANSPORT_HANDLE_DATA)callbackCtx;
        IOTHUB_IDENTITY_TYPE type;

        const char* topicName = mqttmessage_getTopicName(msgHandle);
        if (topicName == NULL)
        {
            LogError("Failure: NULL topic name encountered");
        }
        else if (retrieveTopicType(transportData, topicName, &type) != 0)
        {
            LogError("Received unexpected topic.  Ignoring remainder of request");
        }
        else
        {
            if (type == IOTHUB_TYPE_DEVICE_TWIN)
            {
                processTwinNotification(transportData, msgHandle, topicName);
            }
            else if (type == IOTHUB_TYPE_DEVICE_METHODS)
            {
                processDeviceMethodNotification(transportData, msgHandle, topicName);
            }
            else
            {
                processIncomingMessageNotification(transportData, msgHandle, topicName, type);
            }
        }
    }

    return MQTT_CLIENT_ACK_NONE;
}